

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrShaders.hpp
# Opt level: O2

void __thiscall rr::FragmentShader::~FragmentShader(FragmentShader *this)

{
  this->_vptr_FragmentShader = (_func_int **)&PTR___cxa_pure_virtual_00c0c258;
  std::_Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::~_Vector_base
            (&(this->m_outputs).
              super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>);
  std::_Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::~_Vector_base
            (&(this->m_inputs).
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>);
  return;
}

Assistant:

~FragmentShader		(void) {}